

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token __thiscall slang::parsing::Lexer::lexStringLiteral(Lexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  SmallVector<char,_40UL> *this_00;
  LanguageVersion LVar3;
  bool bVar4;
  char cVar5;
  bool bVar6;
  uint uVar7;
  DiagCode DVar8;
  int iVar9;
  Diagnostic *in_RAX;
  Diagnostic *pDVar10;
  undefined4 extraout_var;
  char cVar11;
  EVP_PKEY_CTX *in_RDX;
  char *pcVar12;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  EVP_PKEY_CTX *extraout_RDX_02;
  EVP_PKEY_CTX *extraout_RDX_03;
  EVP_PKEY_CTX *extraout_RDX_04;
  EVP_PKEY_CTX *extraout_RDX_05;
  EVP_PKEY_CTX *extraout_RDX_06;
  EVP_PKEY_CTX *extraout_RDX_07;
  EVP_PKEY_CTX *extraout_RDX_08;
  EVP_PKEY_CTX *extraout_RDX_09;
  char *curr;
  byte *pbVar13;
  DiagCode code;
  size_t sVar14;
  long lVar15;
  bool alreadyErrored;
  string_view arg;
  string_view arg_00;
  Token TVar16;
  char c;
  uint32_t unicodeChar;
  int unicodeLen;
  byte local_49;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  undefined4 local_38;
  int local_34;
  
  pbVar13 = (byte *)this->sourceBuffer;
  if ((*pbVar13 == 0x22) && (pbVar13[1] == 0x22)) {
    if ((int)(this->options).languageVersion < 1) {
      pDVar10 = Diagnostics::add(this->diagnostics,(DiagCode)0x20001,
                                 (SourceLocation)
                                 ((long)(pbVar13 + ~(ulong)this->originalBegin) * 0x10000000 |
                                 (ulong)((this->bufferId).id & 0xfffffff)));
      LVar3 = (this->options).languageVersion;
      sVar14 = 9;
      if (LVar3 == Default) {
        pcVar12 = "1800-2017";
      }
      else if (LVar3 == v1800_2023) {
        pcVar12 = "1800-2023";
      }
      else {
        pcVar12 = "";
        sVar14 = 0;
      }
      arg._M_str = pcVar12;
      arg._M_len = sVar14;
      in_RAX = Diagnostic::operator<<(pDVar10,arg);
      pbVar13 = (byte *)this->sourceBuffer;
      in_RDX = extraout_RDX;
    }
    pbVar13 = pbVar13 + 2;
    this->sourceBuffer = (char *)pbVar13;
    local_38 = (undefined4)CONCAT71((int7)((ulong)in_RAX >> 8),1);
  }
  else {
    local_38 = 0;
  }
  this_00 = &this->stringBuffer;
  (this->stringBuffer).super_SmallVectorBase<char>.len = 0;
  alreadyErrored = false;
  do {
    lVar15 = (long)pbVar13 - (long)this->originalBegin;
    local_49 = *pbVar13;
    if (local_49 == 0x22) {
      pbVar1 = pbVar13 + 1;
      if ((char)local_38 == '\0') {
        this->sourceBuffer = (char *)pbVar1;
        goto LAB_00230597;
      }
      if ((*pbVar1 == 0x22) && (pbVar13[2] == 0x22)) {
        this->sourceBuffer = (char *)(pbVar13 + 3);
        goto LAB_00230597;
      }
      this->sourceBuffer = (char *)pbVar1;
LAB_0023029d:
      SmallVectorBase<char>::emplace_back<char_const&>
                (&this_00->super_SmallVectorBase<char>,(char *)&local_49);
      alreadyErrored = false;
      in_RDX = extraout_RDX_01;
    }
    else if (local_49 == 0x5c) {
      pbVar1 = pbVar13 + 1;
      this->sourceBuffer = (char *)pbVar1;
      local_49 = pbVar13[1];
      in_RDX = (EVP_PKEY_CTX *)CONCAT71((int7)((ulong)in_RDX >> 8),local_49);
      pbVar2 = pbVar13 + 2;
      this->sourceBuffer = (char *)pbVar2;
      uVar7 = (uint)local_49;
      if (local_49 < 0x5c) {
        if (local_49 < 0x30) {
          if (uVar7 != 10) {
            if (uVar7 != 0xd) {
              if (uVar7 == 0x22) {
                local_48._M_len = CONCAT71(local_48._M_len._1_7_,0x22);
                goto LAB_0023049c;
              }
              goto LAB_002304c1;
            }
            if (*pbVar2 == 10) {
              this->sourceBuffer = (char *)(pbVar13 + 3);
            }
          }
        }
        else {
          if (uVar7 - 0x30 < 8) {
            uVar7 = (uint)(byte)(local_49 - 0x30);
            local_49 = *pbVar2;
            if ((local_49 & 0xf8) == 0x30) {
              this->sourceBuffer = (char *)(pbVar13 + 3);
              uVar7 = (uint)(byte)(local_49 - 0x30) + uVar7 * 8;
              local_49 = pbVar13[3];
              if ((local_49 & 0xf8) == 0x30) {
                this->sourceBuffer = (char *)(pbVar13 + 4);
                if (0x1f < uVar7) {
                  Diagnostics::add(this->diagnostics,(DiagCode)0xd0002,
                                   (SourceLocation)
                                   (lVar15 * 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)))
                  ;
                  in_RDX = extraout_RDX_00;
                  goto LAB_002304a9;
                }
                uVar7 = (uint)(byte)(local_49 - 0x30) + uVar7 * 8;
              }
            }
            local_48._M_len = CONCAT71(local_48._M_len._1_7_,(char)uVar7);
            goto LAB_0023049c;
          }
LAB_002304c1:
          this->sourceBuffer = (char *)pbVar1;
          bVar6 = scanUTF8Char(this,alreadyErrored,(uint32_t *)&local_48,&local_34);
          in_RDX = extraout_RDX_06;
          bVar4 = true;
          if (bVar6) {
            bVar6 = isPrintableUnicode((uint32_t)local_48._M_len);
            in_RDX = extraout_RDX_07;
            bVar4 = alreadyErrored;
            if (bVar6) {
              DVar8.subsystem = Lexer;
              DVar8.code = 0x15;
              code.subsystem = Lexer;
              code.code = 0x18;
              if (local_49 == 0x25) {
                code = DVar8;
              }
              pDVar10 = Diagnostics::add(this->diagnostics,code,
                                         (SourceLocation)
                                         (lVar15 * 0x10000000 |
                                         (ulong)((this->bufferId).id & 0xfffffff)));
              arg_00._M_len = (size_t)local_34;
              arg_00._M_str = (char *)pbVar1;
              Diagnostic::operator<<(pDVar10,arg_00);
              in_RDX = extraout_RDX_08;
            }
          }
          this->sourceBuffer = (char *)pbVar1;
          alreadyErrored = bVar4;
        }
      }
      else {
        if (local_49 < 0x6e) {
          if (uVar7 == 0x5c) {
            local_48._M_len = CONCAT71(local_48._M_len._1_7_,0x5c);
          }
          else if (uVar7 == 0x61) {
            local_48._M_len = CONCAT71(local_48._M_len._1_7_,7);
          }
          else {
            if (uVar7 != 0x66) goto LAB_002304c1;
            local_48._M_len = CONCAT71(local_48._M_len._1_7_,0xc);
          }
        }
        else if (uVar7 == 0x75 || local_49 < 0x75) {
          if (uVar7 == 0x6e) {
            local_48._M_len = CONCAT71(local_48._M_len._1_7_,10);
          }
          else {
            if (uVar7 != 0x74) goto LAB_002304c1;
            local_48._M_len = CONCAT71(local_48._M_len._1_7_,9);
          }
        }
        else if (uVar7 == 0x76) {
          local_48._M_len = CONCAT71(local_48._M_len._1_7_,0xb);
        }
        else {
          if (uVar7 != 0x78) goto LAB_002304c1;
          local_49 = *pbVar2;
          if (((byte)(local_49 - 0x30) < 10) ||
             ((local_49 - 0x41 < 0x26 &&
              ((0x3f0000003fU >> ((ulong)(local_49 - 0x41) & 0x3f) & 1) != 0)))) {
            this->sourceBuffer = (char *)(pbVar13 + 3);
            cVar5 = (local_49 < 0x47) * ' ' + -0x57;
            if (local_49 < 0x3a) {
              cVar5 = -0x30;
            }
            cVar5 = cVar5 + local_49;
            local_49 = pbVar13[3];
            if (((byte)(local_49 - 0x30) < 10) ||
               ((local_49 - 0x41 < 0x26 &&
                ((0x3f0000003fU >> ((ulong)(local_49 - 0x41) & 0x3f) & 1) != 0)))) {
              cVar11 = (local_49 < 0x47) * ' ' + -0x57;
              if (local_49 < 0x3a) {
                cVar11 = -0x30;
              }
              this->sourceBuffer = (char *)(pbVar13 + 4);
              cVar5 = cVar11 + local_49 + cVar5 * '\x10';
            }
            local_48._M_len = CONCAT71(local_48._M_len._1_7_,cVar5);
          }
          else {
            Diagnostics::add(this->diagnostics,(DiagCode)0x90002,
                             (SourceLocation)
                             (lVar15 * 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
            local_48._M_len = CONCAT71(local_48._M_len._1_7_,0x78);
          }
        }
LAB_0023049c:
        SmallVectorBase<char>::emplace_back<char>
                  (&this_00->super_SmallVectorBase<char>,(char *)&local_48);
        in_RDX = extraout_RDX_05;
      }
    }
    else {
      if ((local_49 == 10 || local_49 == 0xd) && (char)local_38 == '\0') {
LAB_00230567:
        Diagnostics::add(this->diagnostics,(DiagCode)0x70002,
                         (SourceLocation)
                         (lVar15 * 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
        in_RDX = extraout_RDX_09;
LAB_00230597:
        iVar9 = SmallVectorBase<char>::copy
                          (&this_00->super_SmallVectorBase<char>,(EVP_PKEY_CTX *)this->alloc,in_RDX)
        ;
        local_48._M_str = (char *)CONCAT44(extraout_var,iVar9);
        TVar16 = create<std::basic_string_view<char,std::char_traits<char>>>
                           (this,StringLiteral,&local_48);
        return TVar16;
      }
      if (local_49 == 0) {
        if (this->sourceEnd + -1 <= pbVar13) goto LAB_00230567;
        this->errorCount = this->errorCount + 1;
        Diagnostics::add(this->diagnostics,(DiagCode)0x50002,
                         (SourceLocation)
                         (lVar15 * 0x10000000 | (ulong)((this->bufferId).id & 0xfffffff)));
        this->sourceBuffer = this->sourceBuffer + 1;
        in_RDX = extraout_RDX_02;
      }
      else {
        if (-1 < (char)local_49) {
          this->sourceBuffer = (char *)(pbVar13 + 1);
          goto LAB_0023029d;
        }
        bVar4 = scanUTF8Char(this,alreadyErrored,(uint32_t *)&local_48,&local_34);
        in_RDX = extraout_RDX_03;
        if (0 < local_34) {
          lVar15 = 0;
          do {
            SmallVectorBase<char>::emplace_back<char_const&>
                      (&this_00->super_SmallVectorBase<char>,(char *)(pbVar13 + lVar15));
            lVar15 = lVar15 + 1;
            in_RDX = extraout_RDX_04;
          } while (lVar15 < local_34);
        }
        alreadyErrored = (bool)(alreadyErrored | !bVar4);
      }
    }
LAB_002304a9:
    pbVar13 = (byte *)this->sourceBuffer;
  } while( true );
}

Assistant:

Token Lexer::lexStringLiteral() {
    bool tripleQuoted = false;
    if (peek() == '"' && peek(1) == '"') {
        // New in v1800-2023: triple quoted string literals
        if (options.languageVersion < LanguageVersion::v1800_2023) {
            addDiag(diag::WrongLanguageVersion, currentOffset() - 1)
                << toString(options.languageVersion);
        }
        tripleQuoted = true;
        advance(2);
    }

    stringBuffer.clear();
    bool sawUTF8Error = false;
    while (true) {
        size_t offset = currentOffset();
        char c = peek();

        if (c == '\\') {
            advance();
            c = peek();
            advance();

            uint32_t charCode;
            switch (c) {
                    // clang-format off
                case 'n': stringBuffer.push_back('\n'); break;
                case 't': stringBuffer.push_back('\t'); break;
                case '\\': stringBuffer.push_back('\\'); break;
                case '"': stringBuffer.push_back('"'); break;
                case 'v': stringBuffer.push_back('\v'); break;
                case 'f': stringBuffer.push_back('\f'); break;
                case 'a': stringBuffer.push_back('\a'); break;
                case '\n': break;
                case '\r': consume('\n'); break;
                case '0': case '1': case '2': case '3':
                case '4': case '5': case '6': case '7':
                    // clang-format on
                    // octal character code
                    charCode = getDigitValue(c);
                    if (isOctalDigit(c = peek())) {
                        advance();
                        charCode = (charCode * 8) + getDigitValue(c);
                        if (isOctalDigit(c = peek())) {
                            advance();
                            charCode = (charCode * 8) + getDigitValue(c);
                            if (charCode > 255) {
                                addDiag(diag::OctalEscapeCodeTooBig, offset);
                                break;
                            }
                        }
                    }
                    stringBuffer.push_back((char)charCode);
                    break;
                case 'x':
                    c = peek();
                    if (!isHexDigit(c)) {
                        addDiag(diag::InvalidHexEscapeCode, offset);
                        stringBuffer.push_back('x');
                    }
                    else {
                        advance();
                        charCode = getHexDigitValue(c);
                        if (isHexDigit(c = peek())) {
                            advance();
                            charCode = (charCode * 16) + getHexDigitValue(c);
                        }
                        stringBuffer.push_back((char)charCode);
                    }
                    break;
                default: {
                    auto curr = --sourceBuffer;

                    uint32_t unicodeChar;
                    int unicodeLen;
                    if (scanUTF8Char(sawUTF8Error, &unicodeChar, unicodeLen)) {
                        if (isPrintableUnicode(unicodeChar)) {
                            // '\%' is not an actual escape code but other tools silently allow it
                            // and major UVM headers use it, so we'll issue a (fairly quiet) warning
                            // about it. Otherwise issue a louder warning (on by default).
                            DiagCode code = c == '%' ? diag::NonstandardEscapeCode
                                                     : diag::UnknownEscapeCode;
                            addDiag(code, offset) << std::string_view(curr, (size_t)unicodeLen);
                        }
                    }
                    else {
                        sawUTF8Error = true;
                    }

                    // Back up so that we handle this character as a normal char in the outer loop,
                    // regardless of whether it's valid or not.
                    sourceBuffer = curr;
                    break;
                }
            }
        }
        else if (c == '"') {
            if (tripleQuoted) {
                if (peek(1) == '"' && peek(2) == '"') {
                    advance(3);
                    break;
                }
                else {
                    advance();
                    stringBuffer.push_back(c);
                    sawUTF8Error = false;
                }
            }
            else {
                advance();
                break;
            }
        }
        else if (isNewline(c) && !tripleQuoted) {
            addDiag(diag::ExpectedClosingQuote, offset);
            break;
        }
        else if (c == '\0') {
            if (reallyAtEnd()) {
                addDiag(diag::ExpectedClosingQuote, offset);
                break;
            }

            // otherwise just error and ignore
            errorCount++;
            addDiag(diag::EmbeddedNull, offset);
            advance();
        }
        else if (isASCII(c)) {
            advance();
            stringBuffer.push_back(c);
            sawUTF8Error = false;
        }
        else {
            auto curr = sourceBuffer;

            uint32_t unused;
            int unicodeLen;
            sawUTF8Error |= !scanUTF8Char(sawUTF8Error, &unused, unicodeLen);

            // Regardless of whether the character sequence was valid or not
            // we want to add the bytes to the string, to allow for cases where
            // the source is actually something like latin-1 encoded. Ignoring the
            // warning and carrying on will do the right thing for them.
            for (int i = 0; i < unicodeLen; i++)
                stringBuffer.push_back(curr[i]);
        }
    }

    return create(TokenKind::StringLiteral, toStringView(stringBuffer.copy(alloc)));
}